

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

String * __thiscall
Corrade::Utility::String::replaceAll
          (String *__return_storage_ptr__,String *this,StringView string,StringView search,
          StringView replace)

{
  StringView substring;
  _func_void_char_ptr_unsigned_long *deleter;
  String *pSVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  ostream *poVar5;
  char *pcVar6;
  size_t sVar7;
  size_t valueCount_2;
  char *pcVar8;
  char *valueData;
  size_t valueCount;
  bool bVar9;
  BasicStringView<const_char> BVar10;
  ArrayView<const_char> AVar11;
  char local_a9;
  Array<char,_void_(*)(char_*,_unsigned_long)> local_a8;
  BasicStringView<const_char> local_88;
  char *local_78;
  Error local_70;
  String *local_48;
  char *local_40;
  char *local_38;
  
  local_38 = search._data;
  local_40 = (char *)string._sizePlusFlags;
  local_88._sizePlusFlags = (size_t)string._data;
  local_88._data = (char *)this;
  local_48 = __return_storage_ptr__;
  if (((undefined1  [16])search & (undefined1  [16])0x3fffffffffffffff) == (undefined1  [16])0x0) {
    poVar5 = Error::defaultOutput();
    Error::Error(&local_70,poVar5,(Flags)0x0);
    Debug::operator<<(&local_70.super_Debug,
                      "Utility::String::replaceAll(): empty search string would cause an infinite loop"
                     );
  }
  else {
    local_a8._data = (char *)0x0;
    local_a8._size = 0;
    local_a8._deleter = (_func_void_char_ptr_unsigned_long *)0x0;
    do {
      substring._sizePlusFlags = (size_t)local_38;
      substring._data = local_40;
      BVar10 = Containers::BasicStringView<const_char>::find(&local_88,substring);
      pcVar2 = BVar10._data;
      bVar9 = ((undefined1  [16])BVar10 & (undefined1  [16])0x3fffffffffffffff) !=
              (undefined1  [16])0x0;
      if (!bVar9 || pcVar2 == (char *)0x0) break;
      local_70.super_Debug._0_16_ =
           Containers::BasicStringView<const_char>::slice(&local_88,local_88._data,pcVar2);
      AVar11 = Containers::Implementation::
               ArrayViewConverter<const_char,_Corrade::Containers::BasicStringView<const_char>_>::
               from((BasicStringView<const_char> *)&local_70);
      sVar7 = AVar11._size;
      local_78 = local_a8._data;
      pcVar4 = (char *)local_a8._size;
      if (local_a8._deleter == Containers::ArrayMallocAllocator<char>::deleter) {
        pcVar4 = (char *)(*(long *)(local_a8._data + -8) + -8);
      }
      pcVar3 = Containers::Implementation::
               arrayGrowBy<char,Corrade::Containers::ArrayMallocAllocator<char>>(&local_a8,sVar7);
      if (sVar7 != 0) {
        pcVar6 = AVar11._data + -(long)local_78;
        pcVar8 = pcVar6;
        if (pcVar4 <= pcVar6) {
          pcVar8 = (char *)0xffffffffffffffff;
        }
        pcVar8 = local_a8._data + (long)pcVar8;
        if (pcVar4 <= pcVar6) {
          pcVar8 = AVar11._data;
        }
        memcpy(pcVar3,pcVar8,sVar7);
      }
      AVar11 = Containers::Implementation::
               ArrayViewConverter<const_char,_Corrade::Containers::BasicStringView<const_char>_>::
               from(&replace);
      sVar7 = AVar11._size;
      local_78 = local_a8._data;
      pcVar4 = (char *)local_a8._size;
      if (local_a8._deleter == Containers::ArrayMallocAllocator<char>::deleter) {
        pcVar4 = (char *)(*(long *)(local_a8._data + -8) + -8);
      }
      pcVar3 = Containers::Implementation::
               arrayGrowBy<char,Corrade::Containers::ArrayMallocAllocator<char>>(&local_a8,sVar7);
      if (sVar7 != 0) {
        pcVar6 = AVar11._data + -(long)local_78;
        pcVar8 = pcVar6;
        if (pcVar4 <= pcVar6) {
          pcVar8 = (char *)0xffffffffffffffff;
        }
        pcVar8 = local_a8._data + (long)pcVar8;
        if (pcVar4 <= pcVar6) {
          pcVar8 = AVar11._data;
        }
        memcpy(pcVar3,pcVar8,sVar7);
      }
      local_88 = Containers::BasicStringView<const_char>::slice
                           (&local_88,pcVar2 + (BVar10._sizePlusFlags & 0x3fffffffffffffff),
                            local_88._data + (local_88._sizePlusFlags & 0x3fffffffffffffff));
    } while (bVar9 && pcVar2 != (char *)0x0);
    AVar11 = Containers::Implementation::
             ArrayViewConverter<const_char,_Corrade::Containers::BasicStringView<const_char>_>::from
                       (&local_88);
    pcVar2 = local_a8._data;
    sVar7 = AVar11._size;
    pcVar4 = (char *)local_a8._size;
    if (local_a8._deleter == Containers::ArrayMallocAllocator<char>::deleter) {
      pcVar4 = (char *)(*(long *)(local_a8._data + -8) + -8);
    }
    pcVar3 = Containers::Implementation::
             arrayGrowBy<char,Corrade::Containers::ArrayMallocAllocator<char>>(&local_a8,sVar7);
    if (sVar7 != 0) {
      pcVar8 = AVar11._data + -(long)pcVar2;
      pcVar2 = (char *)0xffffffffffffffff;
      if (pcVar8 < pcVar4) {
        pcVar2 = pcVar8;
      }
      pcVar2 = local_a8._data + (long)pcVar2;
      if (pcVar4 <= pcVar8) {
        pcVar2 = AVar11._data;
      }
      memcpy(pcVar3,pcVar2,sVar7);
    }
    local_a9 = '\0';
    pcVar2 = (char *)local_a8._size;
    if (local_a8._deleter == Containers::ArrayMallocAllocator<char>::deleter) {
      pcVar2 = (char *)(*(long *)(local_a8._data + -8) - 8);
    }
    if (&local_a9 + -(long)local_a8._data < pcVar2) {
      poVar5 = Error::defaultOutput();
      Error::Error(&local_70,poVar5,(Flags)0x0);
      Debug::operator<<(&local_70.super_Debug,
                        "Containers::arrayAppend(): use the list variant to append values from within the array itself"
                       );
    }
    else {
      pcVar4 = Containers::Implementation::
               arrayGrowBy<char,Corrade::Containers::ArrayMallocAllocator<char>>(&local_a8,1);
      pSVar1 = local_48;
      deleter = local_a8._deleter;
      sVar7 = local_a8._size;
      pcVar2 = local_a8._data;
      *pcVar4 = local_a9;
      if (local_a8._deleter != (_func_void_char_ptr_unsigned_long *)0x0) {
        local_a8._data = (char *)0x0;
        local_a8._size = 0;
        local_a8._deleter = (_func_void_char_ptr_unsigned_long *)0x0;
        Containers::String::String
                  (local_48,pcVar2,(size_t)(sVar7 + -1),(_func_void_char_ptr_size_t *)deleter);
        Containers::Array<char,_void_(*)(char_*,_unsigned_long)>::~Array(&local_a8);
        return pSVar1;
      }
      poVar5 = Error::defaultOutput();
      Error::Error(&local_70,poVar5,(Flags)0x0);
      Debug::operator<<(&local_70.super_Debug,
                        "Assertion deleter failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/String.cpp:1110"
                       );
    }
  }
  Error::~Error(&local_70);
  abort();
}

Assistant:

Containers::String replaceAll(Containers::StringView string, const Containers::StringView search, const Containers::StringView replace) {
    CORRADE_ASSERT(!search.isEmpty(),
        "Utility::String::replaceAll(): empty search string would cause an infinite loop", {});
    Containers::Array<char> output;
    while(const Containers::StringView found = string.find(search)) {
        arrayAppend(output, string.prefix(found.begin()));
        arrayAppend(output, replace);
        string = string.slice(found.end(), string.end());
    }
    arrayAppend(output, string);
    arrayAppend(output, '\0');
    const std::size_t size = output.size();
    /* This assumes that the growable array uses std::malloc() (which has to be
       std::free()'d later) in order to be able to std::realloc(). The deleter
       doesn't use the size argument so it should be fine to transfer it over
       to a String with the size excluding the null terminator. */
    void(*const deleter)(char*, std::size_t) = output.deleter();
    CORRADE_INTERNAL_ASSERT(deleter);
    return Containers::String{output.release(), size - 1, deleter};
}